

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_logger.h
# Opt level: O1

void cfd::core::logger::log<std::__cxx11::string_const&>
               (CfdSourceLocation *source,CfdLogLevel lvl,char *fmt,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  char cVar1;
  size_t sVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> message;
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  pointer local_38;
  size_type sStack_30;
  
  cVar1 = cfd::core::logger::IsEnableLogLevel(lvl);
  if (cVar1 != '\0') {
    local_38 = (args->_M_dataplus)._M_p;
    sStack_30 = args->_M_string_length;
    sVar2 = strlen(fmt);
    ::fmt::v7::detail::vformat_abi_cxx11_(local_58,fmt,sVar2,0xd,&local_38);
    cfd::core::logger::WriteLog(source,lvl,(string *)local_58);
    if (local_58[0] != local_48) {
      operator_delete(local_58[0]);
    }
  }
  return;
}

Assistant:

void log(
    const CfdSourceLocation &source, cfd::core::logger::CfdLogLevel lvl,
    const char *fmt, Args &&...args) {
  if (cfd::core::logger::IsEnableLogLevel(lvl)) {
    auto message = fmt::format(fmt, args...);
    // std::string message = fmt::format(std::locale::messages, fmt, args...);
    cfd::core::logger::WriteLog(source, lvl, message);
  }
}